

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  ImGuiViewport *pIVar1;
  bool bVar2;
  ImGuiViewportP **ppIVar3;
  float _y;
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImGuiViewport *viewport;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003e4;
  bool *in_stack_000003e8;
  char *in_stack_000003f0;
  uint in_stack_ffffffffffffffb4;
  ImVec2 local_48;
  float in_stack_ffffffffffffffc0;
  uint uVar4;
  ImGuiStyleVar in_stack_ffffffffffffffc4;
  ImVec2 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd4;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiViewportP *local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  local_18 = *ppIVar3;
  _x = (local_10->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((local_10->Style).DisplaySafeAreaPadding.y - (local_10->Style).FramePadding.y,
                    0.0);
  ImVec2::ImVec2(&local_20,_x,_y);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_20;
  pIVar1 = &local_18->super_ImGuiViewport;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  SetNextWindowPos(&pIVar1->Pos,0,&local_28);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(local_18->super_ImGuiViewport).Size.x,
                 (local_10->NextWindowData).MenuBarOffsetMinVal.y + local_10->FontBaseSize +
                 (local_10->Style).FramePadding.y);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffd0,0);
  SetNextWindowViewport((local_18->super_ImGuiViewport).ID);
  PushStyleVar(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,0.0,0.0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffd4,(ImVec2 *)in_stack_ffffffffffffffc8);
  bVar2 = Begin(in_stack_000003f0,in_stack_000003e8,in_stack_000003e4);
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  if (bVar2) {
    bVar2 = BeginMenuBar();
    in_stack_ffffffffffffffb4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffb4);
  }
  uVar4 = in_stack_ffffffffffffffb4 & 0xff000000;
  PopStyleVar(in_stack_ffffffffffffffb4);
  ImVec2::ImVec2(&local_48,0.0,0.0);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_48;
  bVar2 = (uVar4 & 0x1000000) != 0;
  if (!bVar2) {
    End();
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewport* viewport = g.Viewports[0];
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(viewport->Pos);
    SetNextWindowSize(ImVec2(viewport->Size.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our onw viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}